

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O1

void rev_fak(kcc_joint *joint,joint_acceleration *qdd,gc_acc_twist *xdd)

{
  joint_axis jVar1;
  vector3 *pvVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  
  pvVar2 = xdd->angular_acceleration;
  (pvVar2->field_0).field_0.z = 0.0;
  (pvVar2->field_0).field_0.x = 0.0;
  (pvVar2->field_0).field_0.y = 0.0;
  pvVar2 = xdd->linear_acceleration;
  (pvVar2->field_0).field_0.z = 0.0;
  (pvVar2->field_0).field_0.x = 0.0;
  (pvVar2->field_0).field_0.y = 0.0;
  jVar1 = (joint->field_1).revolute_joint.axis;
  uVar3 = 0;
  uVar4 = 0;
  dVar5 = 0.0;
  if (jVar1 == JOINT_AXIS_X) {
    dVar5 = *qdd;
  }
  (xdd->angular_acceleration->field_0).field_0.x = dVar5;
  if (jVar1 == JOINT_AXIS_Y) {
    uVar3 = SUB84(*qdd,0);
    uVar4 = (undefined4)((ulong)*qdd >> 0x20);
  }
  (xdd->angular_acceleration->field_0).field_0.y = (double)CONCAT44(uVar4,uVar3);
  uVar3 = 0;
  uVar4 = 0;
  if (jVar1 == JOINT_AXIS_Z) {
    uVar3 = SUB84(*qdd,0);
    uVar4 = (undefined4)((ulong)*qdd >> 0x20);
  }
  (xdd->angular_acceleration->field_0).field_0.z = (double)CONCAT44(uVar4,uVar3);
  return;
}

Assistant:

static void rev_fak(
        const struct kcc_joint *joint,
        const joint_acceleration *qdd,
        struct gc_acc_twist *xdd)
{
    // initialize to 0.0
    memset(xdd->angular_acceleration, 0, sizeof(*xdd->angular_acceleration));
    memset(xdd->linear_acceleration, 0, sizeof(*xdd->linear_acceleration));

    enum joint_axis axis = joint->revolute_joint.axis;
    xdd->angular_acceleration->x = (axis == JOINT_AXIS_X) ? qdd[0] : 0.0;
    xdd->angular_acceleration->y = (axis == JOINT_AXIS_Y) ? qdd[0] : 0.0;
    xdd->angular_acceleration->z = (axis == JOINT_AXIS_Z) ? qdd[0] : 0.0;
}